

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

double __thiscall NoiseShape::getOutput(NoiseShape *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar1 = this->mTaps;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  dVar4 = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar4 = dVar4 + this->mCoeff[uVar2] * this->mErr[(this->mErrPtr + (int)uVar2) % (int)uVar1];
  }
  return dVar4;
}

Assistant:

double getOutput() {
		double err = .0;
		for (int i=0; i < mTaps; ++i) {
			err += mCoeff[i] * mErr[(mErrPtr + i) % mTaps];
		}
		return err;
	}